

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

size_t __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::popcount
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t begin,size_t end)

{
  word_type wVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar3 = end - begin;
  if (end < begin || uVar3 == 0) {
    sVar5 = 0;
  }
  else {
    uVar2 = (uint)uVar3;
    sVar5 = 0;
    while (begin < end) {
      uVar4 = 0x40;
      if (uVar3 < 0x40) {
        uVar4 = (ulong)(uVar2 & 0x3f);
      }
      wVar1 = get(this,begin,begin + uVar4);
      uVar3 = uVar3 - uVar4;
      sVar5 = sVar5 + POPCOUNT(wVar1);
      begin = begin + uVar4;
    }
  }
  return sVar5;
}

Assistant:

size_t bitview<Container>::popcount(size_t begin, size_t end) const
        {
            if(is_empty_range(begin, end))
                return 0;
            
            check_valid_range(begin, end, size());
            
            size_t len = (end - begin);
            size_t rem = len % W;
            
            size_t result = 0;
            for(size_t step, p = begin;
                p < end;
                len -= step, p += step)
            {
                step = len < W ? rem : W;
                
                result += ::bv::internal::popcount(get(p, p + step));
            }
            
            return result;
        }